

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

Address * __thiscall
cfd::AddressFactory::CreateAddress
          (AddressFactory *this,AddressType address_type,Pubkey *pubkey,Script *script,
          Script *locking_script,Script *redeem_script)

{
  ulong uVar1;
  undefined8 uVar2;
  bool *in_RCX;
  string *message;
  int in_EDX;
  Address *in_RDI;
  long in_R8;
  Script *in_R9;
  Script *in_stack_00000008;
  Script temp_script;
  Address *addr;
  char *in_stack_fffffffffffff368;
  Script *in_stack_fffffffffffff370;
  AddressFactory *in_stack_fffffffffffff378;
  allocator *paVar3;
  string *in_stack_fffffffffffff380;
  undefined8 in_stack_fffffffffffff388;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff390;
  CfdException *this_00;
  Script local_c40;
  undefined1 local_c02;
  allocator local_c01;
  string local_c00 [32];
  char *local_be0;
  undefined4 local_bd8;
  char *local_bd0;
  Pubkey local_bc8;
  Address local_bb0 [376];
  Address local_a38 [376];
  Script local_8c0;
  Address local_888 [376];
  Script local_710;
  Address local_6d8 [376];
  Address local_560 [376];
  Address local_3e8 [376];
  Address local_270 [376];
  Script local_f8;
  byte local_bb;
  undefined1 local_ba;
  undefined1 local_b9 [33];
  char *local_98;
  undefined4 local_90;
  char *local_88;
  undefined1 local_7d;
  allocator local_69;
  string local_68 [32];
  char *local_48;
  undefined4 local_40;
  char *local_38;
  Script *local_30;
  long local_28;
  bool *local_20;
  int local_14;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff388 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  if (((in_RCX == (bool *)0x0) || (uVar1 = cfd::core::Pubkey::IsValid(), (uVar1 & 1) == 0)) &&
     ((local_14 == 2 || (((local_14 == 4 || (local_14 == 6)) || (local_14 == 7)))))) {
    local_48 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_address.cpp"
                       ,0x2f);
    local_48 = local_48 + 1;
    local_40 = 0xe4;
    local_38 = "CreateAddress";
    core::logger::warn<>((CfdSourceLocation *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
    local_7d = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"pubkey hex is empty.",&local_69);
    core::CfdException::CfdException(in_stack_fffffffffffff390,error_code,in_stack_fffffffffffff380)
    ;
    local_7d = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (((local_28 == 0) || (uVar1 = cfd::core::Script::IsEmpty(), (uVar1 & 1) != 0)) &&
     ((local_14 == 1 || ((local_14 == 3 || (local_14 == 5)))))) {
    local_98 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_address.cpp"
                       ,0x2f);
    local_98 = local_98 + 1;
    local_90 = 0xef;
    local_88 = "CreateAddress";
    core::logger::warn<>((CfdSourceLocation *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    this_00 = (CfdException *)local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_b9 + 1),"script hex is empty.",(allocator *)this_00);
    core::CfdException::CfdException
              (this_00,(CfdError)((ulong)uVar2 >> 0x20),in_stack_fffffffffffff380);
    local_ba = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_bb = 0;
  cfd::core::Address::Address(in_RDI);
  cfd::core::Script::Script(&local_f8);
  message = (string *)(ulong)(local_14 - 1);
  switch(message) {
  case (string *)0x0:
    CreateP2shAddress(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
    cfd::core::Address::operator=(in_RDI,local_3e8);
    core::Address::~Address((Address *)in_stack_fffffffffffff370);
    break;
  case (string *)0x1:
    CreateP2pkhAddress(in_stack_fffffffffffff378,(Pubkey *)in_stack_fffffffffffff370);
    cfd::core::Address::operator=(in_RDI,local_270);
    core::Address::~Address((Address *)in_stack_fffffffffffff370);
    break;
  case (string *)0x2:
    CreateP2wshAddress(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
    cfd::core::Address::operator=(in_RDI,local_6d8);
    core::Address::~Address((Address *)in_stack_fffffffffffff370);
    break;
  case (string *)0x3:
    CreateP2wpkhAddress(in_stack_fffffffffffff378,(Pubkey *)in_stack_fffffffffffff370);
    cfd::core::Address::operator=(in_RDI,local_560);
    core::Address::~Address((Address *)in_stack_fffffffffffff370);
    break;
  case (string *)0x4:
    cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_8c0);
    cfd::core::Script::operator=(&local_f8,&local_8c0);
    core::Script::~Script(in_stack_fffffffffffff370);
    CreateP2shAddress(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
    cfd::core::Address::operator=(in_RDI,local_a38);
    core::Address::~Address((Address *)in_stack_fffffffffffff370);
    if (in_stack_00000008 != (Script *)0x0) {
      cfd::core::Script::operator=(in_stack_00000008,&local_f8);
    }
    break;
  case (string *)0x5:
    cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Pubkey *)&local_710);
    cfd::core::Script::operator=(&local_f8,&local_710);
    core::Script::~Script(in_stack_fffffffffffff370);
    CreateP2shAddress(in_stack_fffffffffffff378,in_stack_fffffffffffff370);
    cfd::core::Address::operator=(in_RDI,local_888);
    core::Address::~Address((Address *)in_stack_fffffffffffff370);
    if (in_stack_00000008 != (Script *)0x0) {
      cfd::core::Script::operator=(in_stack_00000008,&local_f8);
    }
    break;
  case (string *)0x6:
    cfd::core::SchnorrPubkey::FromPubkey(&local_bc8,local_20);
    CreateTaprootAddress(in_stack_fffffffffffff378,(SchnorrPubkey *)in_stack_fffffffffffff370);
    cfd::core::Address::operator=(in_RDI,local_bb0);
    core::Address::~Address((Address *)in_stack_fffffffffffff370);
    core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x3d0be1);
    break;
  default:
    local_be0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_address.cpp"
                        ,0x2f);
    local_be0 = local_be0 + 1;
    local_bd8 = 0x118;
    local_bd0 = "CreateAddress";
    core::logger::warn<cfd::core::AddressType&>
              ((CfdSourceLocation *)in_stack_fffffffffffff370,in_stack_fffffffffffff368,
               (AddressType *)0x3d0c81);
    local_c02 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar3 = &local_c01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c00,
               "Invalid address_type. address_type must be \"p2pkh\" or \"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or \"p2sh-p2wsh\"."
               ,paVar3);
    core::CfdException::CfdException(in_stack_fffffffffffff390,error_code,message);
    local_c02 = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (local_30 != (Script *)0x0) {
    cfd::core::Address::GetLockingScript();
    cfd::core::Script::operator=(local_30,&local_c40);
    core::Script::~Script(in_stack_fffffffffffff370);
  }
  local_bb = 1;
  core::Script::~Script(in_stack_fffffffffffff370);
  if ((local_bb & 1) == 0) {
    core::Address::~Address((Address *)in_stack_fffffffffffff370);
  }
  return in_RDI;
}

Assistant:

Address AddressFactory::CreateAddress(
    AddressType address_type, const Pubkey* pubkey, const Script* script,
    Script* locking_script, Script* redeem_script) const {
  if ((pubkey == nullptr) || (!pubkey->IsValid())) {
    if (address_type == AddressType::kP2pkhAddress ||
        address_type == AddressType::kP2wpkhAddress ||
        address_type == AddressType::kP2shP2wpkhAddress ||
        address_type == AddressType::kTaprootAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "pubkey hex is empty.");
    }
  }
  if ((script == nullptr) || (script->IsEmpty())) {
    if (address_type == AddressType::kP2shAddress ||
        address_type == AddressType::kP2wshAddress ||
        address_type == AddressType::kP2shP2wshAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid script hex: script is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "script hex is empty.");
    }
  }
  Address addr;

  Script temp_script;
  switch (address_type) {
    case AddressType::kP2pkhAddress:
      addr = CreateP2pkhAddress(*pubkey);
      break;
    case AddressType::kP2shAddress:
      addr = CreateP2shAddress(*script);
      break;
    case AddressType::kP2wpkhAddress:
      addr = CreateP2wpkhAddress(*pubkey);
      break;
    case AddressType::kP2wshAddress:
      addr = CreateP2wshAddress(*script);
      break;
    case AddressType::kP2shP2wpkhAddress:
      temp_script = ScriptUtil::CreateP2wpkhLockingScript(*pubkey);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kP2shP2wshAddress:
      temp_script = ScriptUtil::CreateP2wshLockingScript(*script);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kTaprootAddress:
      addr = CreateTaprootAddress(SchnorrPubkey::FromPubkey(*pubkey));
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid address type:  address_type={}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2pkh\" or "
          "\"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or "
          "\"p2sh-p2wsh\".");  // NOLINT
      break;
  }
  if (locking_script != nullptr) {
    *locking_script = addr.GetLockingScript();
  }

  return addr;
}